

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O3

Vector * turbulence_3d(Vector *__return_storage_ptr__,Vector *p,int octaves)

{
  double dVar1;
  double dVar2;
  Vector local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  Vector local_38;
  
  local_88.x = p->x;
  local_88.y = p->y;
  dVar1 = p->z;
  Turbulence3dCalls = Turbulence3dCalls + 1;
  if (octaves < 1) {
    local_58 = 0.0;
    dStack_50 = 0.0;
    dVar2 = 0.0;
  }
  else {
    local_58 = 0.0;
    dStack_50 = 0.0;
    dVar2 = 0.0;
    local_68 = 1.0;
    uStack_60 = 0;
    do {
      local_88.z = dVar1;
      local_48 = local_88.x;
      dStack_40 = local_88.y;
      noise_3d(&local_38,&local_88);
      local_58 = local_58 + local_68 * local_38.x;
      dStack_50 = dStack_50 + local_68 * local_38.y;
      dVar2 = dVar2 + local_38.z * local_68;
      local_88.x = local_48 + local_48;
      local_88.y = dStack_40 + dStack_40;
      dVar1 = dVar1 + dVar1;
      local_68 = local_68 * 0.5;
      octaves = octaves + -1;
    } while (octaves != 0);
  }
  __return_storage_ptr__->x = local_58;
  __return_storage_ptr__->y = dStack_50;
  __return_storage_ptr__->z = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Vector turbulence_3d( const Vector&  p, int octaves )
{
   double k = 1;
   Vector r = p;
   Vector res(0);
   int   i;

   Turbulence3dCalls++;

   for( i = 0; i <   octaves; i++ )
   {
      res   += noise_3d(r) * k;
      r *= 2;
      k *= 0.5;
   }
   return res;
}